

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Add_TO_Bill
          (Hospital *this,int choose,vector<int,_std::allocator<int>_> *found,
          vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors,Patient *patient,string *cost,
          vector<Patient,_std::allocator<Patient>_> *All_Of_Patients,string *username,
          string *password)

{
  __type _Var1;
  reference pvVar2;
  ulong uVar3;
  size_type sVar4;
  reference this_00;
  __type local_199;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_160;
  byte local_141;
  undefined1 local_140 [68];
  int local_fc;
  undefined1 local_f8 [4];
  int i;
  undefined1 local_e0 [64];
  undefined1 local_a0 [48];
  undefined1 local_70 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  temp;
  string *cost_local;
  Patient *patient_local;
  vector<Doctor,_std::allocator<Doctor>_> *All_Of_Doctors_local;
  vector<int,_std::allocator<int>_> *found_local;
  int choose_local;
  Hospital *this_local;
  
  temp.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = cost;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_70 + 0x20));
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](found,(long)(choose + -1));
  std::vector<Doctor,_std::allocator<Doctor>_>::operator[](All_Of_Doctors,(long)*pvVar2);
  Human::Last_Name_Getter_abi_cxx11_((Human *)local_70);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_70 + 0x20),(value_type *)local_70);
  std::__cxx11::string::~string((string *)local_70);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](found,(long)(choose + -1));
  std::vector<Doctor,_std::allocator<Doctor>_>::operator[](All_Of_Doctors,(long)*pvVar2);
  Doctor::Field_getter_abi_cxx11_((Doctor *)local_a0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_70 + 0x20),(value_type *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](found,(long)(choose + -1));
  std::vector<Doctor,_std::allocator<Doctor>_>::operator[](All_Of_Doctors,(long)*pvVar2);
  Doctor::Day_Getter_abi_cxx11_((Doctor *)(local_e0 + 0x20));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_70 + 0x20),(value_type *)(local_e0 + 0x20));
  std::__cxx11::string::~string((string *)(local_e0 + 0x20));
  pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](found,(long)(choose + -1));
  std::vector<Doctor,_std::allocator<Doctor>_>::operator[](All_Of_Doctors,(long)*pvVar2);
  Doctor::Time_getter_abi_cxx11_((Doctor *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_70 + 0x20),(value_type *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_70 + 0x20),cost);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_f8,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_70 + 0x20));
  Patient::Bill_Info_setter
            (patient,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f8);
  local_fc = 0;
  do {
    uVar3 = (ulong)local_fc;
    sVar4 = std::vector<Patient,_std::allocator<Patient>_>::size(All_Of_Patients);
    if (sVar4 <= uVar3) {
LAB_00122a5a:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_70 + 0x20));
      return;
    }
    std::vector<Patient,_std::allocator<Patient>_>::operator[](All_Of_Patients,(long)local_fc);
    local_141 = 0;
    Human::User_name_Getter_abi_cxx11_((Human *)(local_140 + 0x20));
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (local_140 + 0x20),username);
    local_199 = false;
    if (_Var1) {
      std::vector<Patient,_std::allocator<Patient>_>::operator[](All_Of_Patients,(long)local_fc);
      Human::Password_Getter_abi_cxx11_((Human *)local_140);
      local_141 = 1;
      local_199 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_140,password);
    }
    if ((local_141 & 1) != 0) {
      std::__cxx11::string::~string((string *)local_140);
    }
    std::__cxx11::string::~string((string *)(local_140 + 0x20));
    if (local_199 != false) {
      this_00 = std::vector<Patient,_std::allocator<Patient>_>::operator[]
                          (All_Of_Patients,(long)local_fc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_160,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_70 + 0x20));
      Patient::Bill_Info_setter(this_00,&local_160);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_160);
      goto LAB_00122a5a;
    }
    local_fc = local_fc + 1;
  } while( true );
}

Assistant:

void  Hospital::  Add_TO_Bill (int choose , vector<int>found , vector<Doctor>All_Of_Doctors, Patient &patient , string cost ,vector<Patient>&All_Of_Patients , string username , string password){

    vector<string>temp;

    temp.push_back(All_Of_Doctors[found[choose - 1]].Last_Name_Getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Field_getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Day_Getter());
    temp.push_back(All_Of_Doctors[found[choose - 1]].Time_getter());
    temp.push_back(cost);

    patient.Bill_Info_setter(temp);

    for (int i = 0; i <All_Of_Patients.size() ; ++i) {
        if(All_Of_Patients[i].User_name_Getter() == username   &&   All_Of_Patients[i].Password_Getter()==password){
            All_Of_Patients[i].Bill_Info_setter(temp);
            break;
        }
    }

}